

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkmaze.c
# Opt level: O3

void restore_waterlevel(memfile *mf,level *lev)

{
  boolean bVar1;
  int8_t iVar2;
  int32_t iVar3;
  bubble *pbVar4;
  bubble **ppbVar5;
  bubble *pbVar6;
  
  bVar1 = on_level(&lev->z,&dungeon_topology.d_water_level);
  if (bVar1 != '\0') {
    bbubbles = (bubble *)0x0;
    wportal = (trap *)&lev->lev_traps;
    do {
      wportal = wportal->ntrap;
      if (wportal == (trap *)0x0) {
        wportal = (trap *)0x0;
        impossible("set_wportal(): no portal!");
        break;
      }
    } while ((wportal->field_0x8 & 0x1f) != 0x12);
    iVar3 = mread32(mf);
    xmin = mread32(mf);
    ymin = mread32(mf);
    xmax = mread32(mf);
    ymax = mread32(mf);
    bubble_up = mread8(mf);
    if (iVar3 < 1) {
      pbVar4 = (bubble *)0x0;
    }
    else {
      pbVar6 = (bubble *)0x0;
      do {
        pbVar4 = (bubble *)malloc(0x28);
        iVar2 = mread8(mf);
        pbVar4->x = iVar2;
        iVar2 = mread8(mf);
        pbVar4->y = iVar2;
        iVar2 = mread8(mf);
        pbVar4->dx = iVar2;
        iVar2 = mread8(mf);
        pbVar4->dy = iVar2;
        iVar2 = mread8(mf);
        pbVar4->bm = bmask[iVar2];
        pbVar4->next = (bubble *)0x0;
        ppbVar5 = &pbVar6->next;
        if (bbubbles == (bubble *)0x0) {
          ppbVar5 = &bbubbles;
          pbVar6 = (bubble *)0x0;
        }
        *ppbVar5 = pbVar4;
        pbVar4->prev = pbVar6;
        iVar3 = iVar3 + -1;
        pbVar6 = pbVar4;
      } while (iVar3 != 0);
    }
    was_waterlevel = 1;
    ebubbles = pbVar4;
  }
  return;
}

Assistant:

void restore_waterlevel(struct memfile *mf, struct level *lev)
{
	struct bubble *b = NULL, *btmp;
	int i, idx;
	int n;

	if (!Is_waterlevel(&lev->z)) return;

	bbubbles = NULL;
	
	set_wportal(lev);
	n = mread32(mf);
	xmin = mread32(mf);
	ymin = mread32(mf);
	xmax = mread32(mf);
	ymax = mread32(mf);
	bubble_up = mread8(mf);
	
	for (i = 0; i < n; i++) {
		btmp = b;
		b = malloc(sizeof(struct bubble));
		b->x = mread8(mf);
		b->y = mread8(mf);
		b->dx = mread8(mf);
		b->dy = mread8(mf);
		idx = mread8(mf);
		b->bm = bmask[idx];
		b->next = NULL;
		
		if (bbubbles) {
			btmp->next = b;
			b->prev = btmp;
		} else {
			bbubbles = b;
			b->prev = NULL;
		}
	}
	ebubbles = b;
	was_waterlevel = TRUE;
}